

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

bool __thiscall VcprojGenerator::openOutput(VcprojGenerator *this,QFile *file,QString *param_3)

{
  bool bVar1;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ProString extension;
  ProString fileName;
  ProString *in_stack_fffffffffffffd18;
  ProString *in_stack_fffffffffffffd20;
  ProKey *in_stack_fffffffffffffd30;
  QMakeEvaluator *in_stack_fffffffffffffd38;
  QMakeEvaluator *this_00;
  ProString *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  CaseSensitivity cs;
  ProString *in_stack_fffffffffffffd50;
  ProString *in_stack_fffffffffffffd58;
  QString *in_stack_fffffffffffffd90;
  QFile *in_stack_fffffffffffffd98;
  MakefileGenerator *in_stack_fffffffffffffda0;
  ProString local_1a0 [6];
  undefined1 local_80 [48];
  undefined1 local_50 [24];
  ProString local_38;
  long local_8;
  
  cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0xaa,0x30);
  (**(code **)(*(long *)in_RSI + 0xe8))(local_50);
  ProString::ProString(in_stack_fffffffffffffd20,&in_stack_fffffffffffffd18->m_string);
  QString::~QString((QString *)0x29a9f4);
  memset(local_80,0xaa,0x30);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
  QMakeEvaluator::first(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  bVar1 = ProString::operator==(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
  if (bVar1) {
    in_stack_fffffffffffffd58 = *(ProString **)(in_RDI + 0xd8);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
    QMakeEvaluator::first(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    ProKey::~ProKey((ProKey *)0x29ab24);
  }
  else {
    in_stack_fffffffffffffd50 = *(ProString **)(in_RDI + 0xd8);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
    QMakeEvaluator::first(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    ProKey::~ProKey((ProKey *)0x29ab0e);
  }
  ProString::~ProString((ProString *)0x29ab31);
  ProKey::~ProKey((ProKey *)0x29ab3e);
  bVar1 = ProString::endsWith(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,cs);
  if (!bVar1) {
    bVar1 = ProString::isEmpty(&local_38);
    if (bVar1) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
      QMakeEvaluator::first(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      bVar1 = ProString::isEmpty(local_1a0);
      if (bVar1) {
        this_00 = *(QMakeEvaluator **)(in_RDI + 0xd8);
        ProKey::ProKey((ProKey *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
        QMakeEvaluator::first(this_00,in_stack_fffffffffffffd30);
      }
      else {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
        QMakeEvaluator::first(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      }
      ProString::operator=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      ProString::~ProString((ProString *)0x29ac7c);
      if (bVar1) {
        ProKey::~ProKey((ProKey *)0x29ac92);
      }
      else {
        ProKey::~ProKey((ProKey *)0x29aca8);
      }
      ProString::~ProString((ProString *)0x29acb5);
      ProKey::~ProKey((ProKey *)0x29acc2);
    }
    ::operator+(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<ProString_&,_ProString_&> *)in_stack_fffffffffffffd18);
    QFile::setFileName(in_RSI);
    QString::~QString((QString *)0x29ad25);
  }
  QString::QString((QString *)0x29ad3d);
  bVar1 = MakefileGenerator::openOutput
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  QString::~QString((QString *)0x29ad5e);
  ProString::~ProString((ProString *)0x29ad6b);
  ProString::~ProString((ProString *)0x29ad78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool VcprojGenerator::openOutput(QFile &file, const QString &/*build*/) const
{
    ProString fileName = file.fileName();
    ProString extension = project->first("TEMPLATE") == "vcsubdirs"
            ? project->first("VCSOLUTION_EXTENSION") : project->first("VCPROJ_EXTENSION");
    if (!fileName.endsWith(extension)) {
        if (fileName.isEmpty()) {
            fileName = !project->first("MAKEFILE").isEmpty()
                    ? project->first("MAKEFILE") : project->first("TARGET");
        }
        file.setFileName(fileName + extension);
    }
    return Win32MakefileGenerator::openOutput(file, QString());
}